

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDefinition.cpp
# Opt level: O1

void __thiscall
Rml::PropertyDefinition::PropertyDefinition
          (PropertyDefinition *this,PropertyId id,String *_default_value,bool _inherited,
          bool _forces_layout)

{
  pointer pcVar1;
  String local_48;
  
  this->id = id;
  pcVar1 = (_default_value->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + _default_value->_M_string_length);
  (this->default_value).value.type = NONE;
  Variant::Set(&(this->default_value).value,&local_48);
  (this->default_value).unit = UNKNOWN;
  (this->default_value).specificity = -1;
  (this->default_value).definition = (PropertyDefinition *)0x0;
  (this->default_value).parser_index = -1;
  (this->default_value).source.
  super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->default_value).source.
  super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  *(undefined8 *)
   ((long)&(this->parsers).
           super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->parsers).
           super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->parsers).
  super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parsers).
  super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->inherited = _inherited;
  this->forces_layout = _forces_layout;
  (this->default_value).definition = this;
  return;
}

Assistant:

PropertyDefinition::PropertyDefinition(PropertyId id, const String& _default_value, bool _inherited, bool _forces_layout) :
	id(id), default_value(_default_value, Unit::UNKNOWN), relative_target(RelativeTarget::None)
{
	inherited = _inherited;
	forces_layout = _forces_layout;
	default_value.definition = this;
}